

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O1

void __thiscall IGameController::DoTeamBalance(IGameController *this)

{
  IConsole *pIVar1;
  CGameContext *pCVar2;
  IServer *pIVar3;
  CPlayer *pCVar4;
  bool bVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int i_1;
  ulong uVar11;
  int i;
  uint Team;
  long lVar12;
  CPlayer *pCVar13;
  long in_FS_OFFSET;
  float fVar14;
  float fVar15;
  float fVar16;
  float aPlayerScore [64];
  float aTeamScore [2];
  float local_148 [66];
  float local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_GameFlags & 1) != 0) && (this->m_pConfig->m_SvTeambalanceTime != 0)) {
    uVar7 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
    uVar10 = -uVar7;
    if (0 < (int)uVar7) {
      uVar10 = uVar7;
    }
    if (1 < uVar10) {
      pIVar1 = this->m_pGameServer->m_pConsole;
      lVar12 = 0;
      (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,2,"game","Balancing teams",0);
      local_40[0] = 0.0;
      local_40[1] = 0.0;
      memset(local_148,0,0x100);
      pCVar2 = this->m_pGameServer;
      pIVar3 = this->m_pServer;
      do {
        pCVar13 = pCVar2->m_apPlayers[lVar12];
        if ((pCVar13 != (CPlayer *)0x0) && (lVar9 = (long)pCVar13->m_Team, lVar9 != -1)) {
          fVar14 = ((float)(pIVar3->m_TickSpeed * pCVar13->m_Score) * 60.0) /
                   (float)(pIVar3->m_CurrentGameTick - pCVar13->m_ScoreStartTick);
          local_148[lVar12] = fVar14;
          local_40[lVar9] = fVar14 + local_40[lVar9];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x40);
      uVar7 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
      bVar5 = uVar7 == 0 || this->m_aTeamSize[0] < this->m_aTeamSize[1];
      uVar10 = -uVar7;
      if (0 < (int)uVar7) {
        uVar10 = uVar7;
      }
      uVar10 = uVar10 >> 1;
      uVar7 = (uint)bVar5;
      Team = uVar7 ^ 1;
      do {
        fVar14 = local_40[bVar5];
        uVar11 = 0;
        pCVar13 = (CPlayer *)0x0;
        fVar6 = fVar14;
        do {
          if (((this->m_pGameServer->m_apPlayers[uVar11] != (CPlayer *)0x0) &&
              (iVar8 = (**this->_vptr_IGameController)(this,uVar11 & 0xffffffff),
              (char)iVar8 != '\0')) &&
             (pCVar4 = this->m_pGameServer->m_apPlayers[uVar11], pCVar4->m_Team == uVar7)) {
            if (pCVar13 != (CPlayer *)0x0) {
              fVar15 = (local_40[Team] + local_148[uVar11]) - (fVar14 - local_148[uVar11]);
              fVar16 = -fVar15;
              if (-fVar15 <= fVar15) {
                fVar16 = fVar15;
              }
              if (fVar6 <= fVar16) goto LAB_001206f3;
            }
            fVar16 = (local_40[Team] + local_148[uVar11]) - (fVar14 - local_148[uVar11]);
            pCVar13 = pCVar4;
            fVar6 = -fVar16;
            if (-fVar16 <= fVar16) {
              fVar6 = fVar16;
            }
          }
LAB_001206f3:
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x40);
        if (pCVar13 != (CPlayer *)0x0) {
          iVar8 = pCVar13->m_LastActionTick;
          DoTeamChange(this,pCVar13,Team,true);
          pCVar13->m_LastActionTick = iVar8;
          CPlayer::Respawn(pCVar13);
          CGameContext::SendGameMsg(this->m_pGameServer,7,pCVar13->m_Team,pCVar13->m_ClientID);
        }
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      this->m_UnbalancedTick = -1;
      CGameContext::SendGameMsg(this->m_pGameServer,3,-1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void IGameController::DoTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime || absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) < NUM_TEAMS)
		return;

	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", "Balancing teams");

	float aTeamScore[NUM_TEAMS] = {0};
	float aPlayerScore[MAX_CLIENTS] = {0.0f};

	// gather stats
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS)
		{
			aPlayerScore[i] = GameServer()->m_apPlayers[i]->m_Score*Server()->TickSpeed()*60.0f/
				(Server()->Tick()-GameServer()->m_apPlayers[i]->m_ScoreStartTick);
			aTeamScore[GameServer()->m_apPlayers[i]->GetTeam()] += aPlayerScore[i];
		}
	}

	int BiggerTeam = (m_aTeamSize[TEAM_RED] > m_aTeamSize[TEAM_BLUE]) ? TEAM_RED : TEAM_BLUE;
	int NumBalance = absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) / NUM_TEAMS;

	// balance teams
	do
	{
		CPlayer *pPlayer = 0;
		float ScoreDiff = aTeamScore[BiggerTeam];
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!GameServer()->m_apPlayers[i] || !CanBeMovedOnBalance(i))
				continue;

			// remember the player whom would cause lowest score-difference
			if(GameServer()->m_apPlayers[i]->GetTeam() == BiggerTeam &&
				(!pPlayer || absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i])) < ScoreDiff))
			{
				pPlayer = GameServer()->m_apPlayers[i];
				ScoreDiff = absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i]));
			}
		}

		// move the player to the other team
		if(pPlayer)
		{
			int Temp = pPlayer->m_LastActionTick;
			DoTeamChange(pPlayer, BiggerTeam^1);
			pPlayer->m_LastActionTick = Temp;
			pPlayer->Respawn();
			GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE_VICTIM, pPlayer->GetTeam(), pPlayer->GetCID());
		}
	}
	while(--NumBalance);

	m_UnbalancedTick = TBALANCE_OK;
	GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE, -1);
}